

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::UninterpretedOption::SerializeWithCachedSizes
          (UninterpretedOption *this,CodedOutputStream *output)

{
  uint uVar1;
  int iVar2;
  UninterpretedOption_NamePart *value;
  char *pcVar3;
  string *psVar4;
  uint64 value_00;
  int64 value_01;
  UnknownFieldSet *unknown_fields;
  double value_02;
  uint local_40;
  uint n;
  uint i;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  UninterpretedOption *this_local;
  
  local_40 = 0;
  uVar1 = name_size(this);
  for (; local_40 < uVar1; local_40 = local_40 + 1) {
    value = name(this,local_40);
    internal::WireFormatLite::WriteMessageMaybeToArray(2,(MessageLite *)value,output);
  }
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 1) != 0) {
    identifier_value_abi_cxx11_(this);
    pcVar3 = (char *)std::__cxx11::string::data();
    identifier_value_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar3,iVar2,SERIALIZE,"google.protobuf.UninterpretedOption.identifier_value");
    psVar4 = identifier_value_abi_cxx11_(this);
    internal::WireFormatLite::WriteStringMaybeAliased(3,psVar4,output);
  }
  if ((uVar1 & 8) != 0) {
    value_00 = positive_int_value(this);
    internal::WireFormatLite::WriteUInt64(4,value_00,output);
  }
  if ((uVar1 & 0x10) != 0) {
    value_01 = negative_int_value(this);
    internal::WireFormatLite::WriteInt64(5,value_01,output);
  }
  if ((uVar1 & 0x20) != 0) {
    value_02 = double_value(this);
    internal::WireFormatLite::WriteDouble(6,value_02,output);
  }
  if ((uVar1 & 2) != 0) {
    psVar4 = string_value_abi_cxx11_(this);
    internal::WireFormatLite::WriteBytesMaybeAliased(7,psVar4,output);
  }
  if ((uVar1 & 4) != 0) {
    aggregate_value_abi_cxx11_(this);
    pcVar3 = (char *)std::__cxx11::string::data();
    aggregate_value_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar3,iVar2,SERIALIZE,"google.protobuf.UninterpretedOption.aggregate_value");
    psVar4 = aggregate_value_abi_cxx11_(this);
    internal::WireFormatLite::WriteStringMaybeAliased(8,psVar4,output);
  }
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = UninterpretedOption::unknown_fields(this);
    internal::WireFormat::SerializeUnknownFields(unknown_fields,output);
  }
  return;
}

Assistant:

void UninterpretedOption::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:google.protobuf.UninterpretedOption)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated .google.protobuf.UninterpretedOption.NamePart name = 2;
  for (unsigned int i = 0, n = this->name_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      2, this->name(i), output);
  }

  cached_has_bits = _has_bits_[0];
  // optional string identifier_value = 3;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->identifier_value().data(), this->identifier_value().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.UninterpretedOption.identifier_value");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      3, this->identifier_value(), output);
  }

  // optional uint64 positive_int_value = 4;
  if (cached_has_bits & 0x00000008u) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(4, this->positive_int_value(), output);
  }

  // optional int64 negative_int_value = 5;
  if (cached_has_bits & 0x00000010u) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64(5, this->negative_int_value(), output);
  }

  // optional double double_value = 6;
  if (cached_has_bits & 0x00000020u) {
    ::google::protobuf::internal::WireFormatLite::WriteDouble(6, this->double_value(), output);
  }

  // optional bytes string_value = 7;
  if (cached_has_bits & 0x00000002u) {
    ::google::protobuf::internal::WireFormatLite::WriteBytesMaybeAliased(
      7, this->string_value(), output);
  }

  // optional string aggregate_value = 8;
  if (cached_has_bits & 0x00000004u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->aggregate_value().data(), this->aggregate_value().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.UninterpretedOption.aggregate_value");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      8, this->aggregate_value(), output);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    ::google::protobuf::internal::WireFormat::SerializeUnknownFields(
        unknown_fields(), output);
  }
  // @@protoc_insertion_point(serialize_end:google.protobuf.UninterpretedOption)
}